

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O2

void wasm::
     CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
     ::doEndCall(Optimizer *self,Expression **currp)

{
  CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
  *this;
  BasicBlock *__from;
  char *__to;
  
  doEndThrowingInst(self,currp);
  if (((self->
       super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
       ).
       super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
       .throwingInstsStack.
       super__Vector_base<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (self->
       super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
       ).
       super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
       .throwingInstsStack.
       super__Vector_base<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((self->
      super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
      ).
      super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
      .ignoreBranchesOutsideOfFunc != false)) {
    return;
  }
  this = (CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
          *)(self->
            super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
            ).
            super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
            .currBasicBlock;
  __from = startBasicBlock(&(self->
                            super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                            ).
                            super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                          );
  link(this,(char *)__from,__to);
  return;
}

Assistant:

static void doEndCall(SubType* self, Expression** currp) {
    doEndThrowingInst(self, currp);
    if (!self->throwingInstsStack.empty() ||
        !self->ignoreBranchesOutsideOfFunc) {
      // |doEndThrowingInst| added a link from the current block to a catch, so
      // we must end the current block and start another. Or, we are not
      // ignoring branches to outside of the function, so even without a branch
      // to a catch we want to start a new basic block here, to preserve the
      // property that control flow transfers (both within the function or to
      // the outside) can only happen at the end of basic blocks.
      auto* last = self->currBasicBlock;
      self->link(last, self->startBasicBlock());
    }
  }